

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,void>
               (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                *container,ostream *os)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  
  std::operator<<(os,'{');
  pcVar1 = (container->_M_dataplus)._M_p;
  sVar2 = container->_M_string_length;
  sVar3 = 0;
  do {
    if (sVar2 == sVar3) {
      if (sVar2 != 0) {
LAB_002b8b60:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((sVar3 != 0) && (std::operator<<(os,','), sVar3 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_002b8b60;
    }
    std::operator<<(os,' ');
    UniversalPrinter<signed_char>::Print(pcVar1 + sVar3,os);
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }